

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5IndexPrepareStmt(Fts5Index *p,sqlite3_stmt **ppStmt,char *zSql)

{
  int iVar1;
  sqlite3_stmt **in_RDX;
  undefined8 in_RSI;
  char *in_RDI;
  sqlite3 *unaff_retaddr;
  int rc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  if (*(int *)(in_RDI + 0x3c) == 0) {
    if (in_RDX == (sqlite3_stmt **)0x0) {
      in_RDI[0x3c] = '\a';
      in_RDI[0x3d] = '\0';
      in_RDI[0x3e] = '\0';
      in_RDI[0x3f] = '\0';
    }
    else {
      iVar1 = sqlite3_prepare_v3(unaff_retaddr,in_RDI,(int)((ulong)in_RSI >> 0x20),(uint)in_RSI,
                                 in_RDX,(char **)CONCAT44(in_stack_ffffffffffffffe4,
                                                          in_stack_ffffffffffffffe0));
      if (iVar1 == 1) {
        iVar1 = 0xb;
      }
      *(int *)(in_RDI + 0x3c) = iVar1;
    }
  }
  sqlite3_free((void *)0x2699a3);
  return *(int *)(in_RDI + 0x3c);
}

Assistant:

static int fts5IndexPrepareStmt(
  Fts5Index *p,
  sqlite3_stmt **ppStmt,
  char *zSql
){
  if( p->rc==SQLITE_OK ){
    if( zSql ){
      int rc = sqlite3_prepare_v3(p->pConfig->db, zSql, -1,
          SQLITE_PREPARE_PERSISTENT|SQLITE_PREPARE_NO_VTAB,
          ppStmt, 0);
      /* If this prepare() call fails with SQLITE_ERROR, then one of the
      ** %_idx or %_data tables has been removed or modified. Call this
      ** corruption.  */
      p->rc = (rc==SQLITE_ERROR ? SQLITE_CORRUPT : rc);
    }else{
      p->rc = SQLITE_NOMEM;
    }
  }
  sqlite3_free(zSql);
  return p->rc;
}